

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void av1_free_mc_tmp_buf(ThreadData *thread_data)

{
  uint8_t *memblk;
  int ref;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    memblk = (uint8_t *)((long)thread_data->mc_buf[lVar1] * 2);
    if (thread_data->mc_buf_use_highbd == 0) {
      memblk = thread_data->mc_buf[lVar1];
    }
    aom_free(memblk);
    thread_data->mc_buf[lVar1] = (uint8_t *)0x0;
  }
  thread_data->mc_buf_size = 0;
  thread_data->mc_buf_use_highbd = 0;
  aom_free(thread_data->tmp_conv_dst);
  thread_data->tmp_conv_dst = (CONV_BUF_TYPE *)0x0;
  aom_free(thread_data->seg_mask);
  thread_data->seg_mask = (uint8_t *)0x0;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    aom_free(thread_data->tmp_obmc_bufs[lVar1]);
    thread_data->tmp_obmc_bufs[lVar1] = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void av1_free_mc_tmp_buf(ThreadData *thread_data) {
  int ref;
  for (ref = 0; ref < 2; ref++) {
    if (thread_data->mc_buf_use_highbd)
      aom_free(CONVERT_TO_SHORTPTR(thread_data->mc_buf[ref]));
    else
      aom_free(thread_data->mc_buf[ref]);
    thread_data->mc_buf[ref] = NULL;
  }
  thread_data->mc_buf_size = 0;
  thread_data->mc_buf_use_highbd = 0;

  aom_free(thread_data->tmp_conv_dst);
  thread_data->tmp_conv_dst = NULL;
  aom_free(thread_data->seg_mask);
  thread_data->seg_mask = NULL;
  for (int i = 0; i < 2; ++i) {
    aom_free(thread_data->tmp_obmc_bufs[i]);
    thread_data->tmp_obmc_bufs[i] = NULL;
  }
}